

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall PhPacker_Arg_g_Test::~PhPacker_Arg_g_Test(PhPacker_Arg_g_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhPacker, Arg_g)
{
   std::string str = PhPacker::pack<float>('g', 1.234f);
   float result = std::any_cast<float>(PhPacker::unpack('g', str));
   float expected = 1.234f;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<float>('g', 65232.123f);
   result = std::any_cast<float>(PhPacker::unpack('g', str));
   expected = 65232.123f;
   GTEST_ASSERT_EQ(result, expected);
}